

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O1

bool __thiscall
msgpack11::Value<(msgpack11::MsgPack::Type)1,_float>::less
          (Value<(msgpack11::MsgPack::Type)1,_float> *this,MsgPackValue *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = (*other->_vptr_MsgPackValue[3])(other);
  iVar3 = (*other->_vptr_MsgPackValue[3])(other);
  bVar1 = true;
  if (iVar3 < 2) {
    if (iVar2 == 1) {
      bVar1 = this->m_value <= *(float *)&other[1]._vptr_MsgPackValue &&
              *(float *)&other[1]._vptr_MsgPackValue != this->m_value;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool less(const MsgPackValue * other) const override {
        bool const is_same_type = tag == other->type();
        bool const is_less_type = tag < other->type();
        return is_less_type || (is_same_type && (m_value < static_cast<const Value<tag, T> *>(other)->m_value));
    }